

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void __thiscall flatbuffers::Parser::ParseField(Parser *this,StructDef *struct_def)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pointer pcVar3;
  BaseType extraout_EAX;
  BaseType BVar4;
  FieldDef *def;
  const_iterator cVar5;
  undefined8 extraout_RAX;
  Parser *this_00;
  Parser *pPVar6;
  Parser *this_01;
  byte bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string name;
  string dc;
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  pointer local_68;
  StructDef *pSStack_60;
  EnumDef *local_58;
  _Base_ptr local_50 [4];
  
  pPVar6 = (Parser *)local_a8;
  this_01 = (Parser *)local_a8;
  p_Var1 = (_Base_ptr)(local_88 + 0x10);
  pcVar3 = (this->attribute_)._M_dataplus._M_p;
  local_88._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar3,pcVar3 + (this->attribute_)._M_string_length);
  p_Var2 = (_Base_ptr)(local_50 + 2);
  pcVar3 = (this->doc_comment_)._M_dataplus._M_p;
  local_50[0] = p_Var2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar3,pcVar3 + (this->doc_comment_)._M_string_length);
  Expect(this,4);
  Expect(this,0x3a);
  local_68 = (pointer)0x0;
  pSStack_60 = (StructDef *)0x0;
  local_58 = (EnumDef *)0x0;
  this_00 = this;
  ParseType(this,(Type *)&local_68);
  BVar4 = (BaseType)local_68;
  if (struct_def->fixed == true) {
    if (((BaseType)local_68 - BASE_TYPE_UTYPE < 0xc) ||
       (((BaseType)local_68 == BASE_TYPE_STRUCT && (pSStack_60->fixed != false))))
    goto LAB_0010c955;
    struct_def = (StructDef *)(local_a8 + 0x10);
    local_a8._0_8_ = struct_def;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"structs_ may contain only scalar or struct fields","");
    Error((string *)local_a8);
    this_00 = pPVar6;
    BVar4 = extraout_EAX;
  }
  if (BVar4 == BASE_TYPE_UNION) {
    local_a8._0_8_ = (Parser *)(local_a8 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_88._0_8_,(pointer)(local_88._0_8_ + local_88._8_8_));
    std::__cxx11::string::append(local_a8);
    AddField(this_01,struct_def,(string *)local_a8,&local_58->underlying_type);
    this_00 = (Parser *)local_a8._0_8_;
    if ((Parser *)local_a8._0_8_ != (Parser *)(local_a8 + 0x10)) {
      operator_delete((void *)local_a8._0_8_);
    }
  }
LAB_0010c955:
  def = AddField(this_00,struct_def,(string *)local_88,(Type *)&local_68);
  if (this->token_ == 0x3d) {
    Next(this);
    ParseSingleValue(this,&def->value);
  }
  std::__cxx11::string::_M_assign((string *)&(def->super_Definition).doc_comment);
  ParseMetaData(this,&def->super_Definition);
  pcVar3 = local_a8 + 0x10;
  local_a8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"deprecated","");
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(def->super_Definition).attributes,(key_type *)local_a8);
  if ((_Rb_tree_header *)cVar5._M_node ==
      &(def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    bVar7 = false;
  }
  else {
    bVar7 = *(long *)(cVar5._M_node + 2) != 0;
  }
  def->deprecated = (bool)bVar7;
  if ((pointer)local_a8._0_8_ != pcVar3) {
    operator_delete((void *)local_a8._0_8_);
    bVar7 = def->deprecated;
  }
  if (((bVar7 & 1) != 0) && (*(char *)&(((Parser *)struct_def)->builder_).buf_.cur_ == '\x01')) {
    local_a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"can\'t deprecate fields in a struct","");
    Error((string *)local_a8);
    if ((pointer)local_a8._0_8_ != pcVar3) {
      operator_delete((void *)local_a8._0_8_);
    }
    if (local_50[0] != p_Var2) {
      operator_delete(local_50[0]);
    }
    if ((_Base_ptr)local_88._0_8_ != p_Var1) {
      operator_delete((void *)local_88._0_8_);
    }
    _Unwind_Resume(extraout_RAX);
  }
  Expect(this,0x3b);
  if (local_50[0] != p_Var2) {
    operator_delete(local_50[0]);
  }
  if ((_Base_ptr)local_88._0_8_ != p_Var1) {
    operator_delete((void *)local_88._0_8_);
  }
  return;
}

Assistant:

void Parser::ParseField(StructDef &struct_def) {
  std::string name = attribute_;
  std::string dc = doc_comment_;
  Expect(kTokenIdentifier);
  Expect(':');
  Type type;
  ParseType(type);

  if (struct_def.fixed && !IsScalar(type.base_type) && !IsStruct(type))
    Error("structs_ may contain only scalar or struct fields");

  if (type.base_type == BASE_TYPE_UNION) {
    // For union fields, add a second auto-generated field to hold the type,
    // with _type appended as the name.
    AddField(struct_def, name + "_type", type.enum_def->underlying_type);
  }

  auto &field = AddField(struct_def, name, type);

  if (token_ == '=') {
    Next();
    ParseSingleValue(field.value);
  }

  field.doc_comment = dc;
  ParseMetaData(field);
  field.deprecated = field.attributes.Lookup("deprecated") != nullptr;
  if (field.deprecated && struct_def.fixed)
    Error("can't deprecate fields in a struct");

  Expect(';');
}